

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

bool ear::insideAngleRange(double x,double start,double end,double tol)

{
  double start_tol;
  double tol_local;
  double end_local;
  double start_local;
  double x_local;
  
  for (tol_local = end; start < tol_local - 360.0; tol_local = tol_local - 360.0) {
  }
  for (; tol_local < start; tol_local = tol_local + 360.0) {
  }
  for (start_local = x; start - tol <= start_local - 360.0; start_local = start_local - 360.0) {
  }
  for (; start_local < start - tol; start_local = start_local + 360.0) {
  }
  return start_local <= tol_local + tol;
}

Assistant:

bool insideAngleRange(double x, double start, double end, double tol) {
    // end is clockwise from start; if end is start + 360, this rotation is
    // preserved; this makes sure that a range of (-180, 180) or (0, 360)
    // means any angle, while (-180, -180) or (0, 0) means a single angle,
    // even though -180/180 and 0/360 are nominally the same angle
    while (end - 360.0 > start) {
      end -= 360.0;
    }
    while (end < start) {
      end += 360.0;
    }
    double start_tol = start - tol;
    while (x - 360.0 >= start_tol) {
      x -= 360.0;
    }
    while (x < start_tol) {
      x += 360.0;
    }
    // x is greater than equal to start-tol, so we only need to compare
    // against the end.
    return x <= end + tol;
  }